

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintMessageStart_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,int field_index,
          int field_count,bool single_line_mode)

{
  size_type *psVar1;
  char *pcVar2;
  undefined3 in_register_00000089;
  StringBaseTextGenerator generator;
  
  psVar1 = &generator.output_._M_string_length;
  generator.output_._M_dataplus._M_p = (pointer)0x0;
  generator.output_._M_string_length._0_1_ = 0;
  pcVar2 = " {\n";
  if (CONCAT31(in_register_00000089,single_line_mode) != 0) {
    pcVar2 = " { ";
  }
  generator.super_BaseTextGenerator._vptr_BaseTextGenerator = (_func_int **)psVar1;
  std::__cxx11::string::append((char *)&generator,(ulong)pcVar2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             generator.super_BaseTextGenerator._vptr_BaseTextGenerator,
             generator.output_._M_dataplus._M_p +
             (long)generator.super_BaseTextGenerator._vptr_BaseTextGenerator);
  if (generator.super_BaseTextGenerator._vptr_BaseTextGenerator != (_func_int **)psVar1) {
    operator_delete(generator.super_BaseTextGenerator._vptr_BaseTextGenerator);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintMessageStart(
    const Message& message, int field_index, int field_count,
    bool single_line_mode) const {
  FORWARD_IMPL(PrintMessageStart, message, field_index, field_count,
               single_line_mode);
}